

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_agree_methods(LIBSSH2_SESSION *session,uchar *data,uint data_len)

{
  int iVar1;
  byte *local_b0;
  uchar *s;
  size_t mac_sc_len;
  size_t mac_cs_len;
  size_t comp_sc_len;
  size_t comp_cs_len;
  size_t crypt_sc_len;
  size_t crypt_cs_len;
  size_t hostkey_len;
  size_t kex_len;
  uchar *mac_sc;
  uchar *mac_cs;
  uchar *comp_sc;
  uchar *comp_cs;
  uchar *crypt_sc;
  uchar *crypt_cs;
  uchar *hostkey;
  uchar *kex;
  uchar *puStack_20;
  uint data_len_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  local_b0 = data + 0x11;
  kex._4_4_ = data_len;
  puStack_20 = data;
  data_local = (uchar *)session;
  iVar1 = kex_string_pair(&local_b0,data,(ulong)data_len,&hostkey_len,&hostkey);
  if ((((iVar1 == 0) &&
       (iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,&crypt_cs_len,&crypt_cs),
       iVar1 == 0)) &&
      (iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,&crypt_sc_len,&crypt_sc),
      iVar1 == 0)) &&
     (((iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,&comp_cs_len,&comp_cs),
       iVar1 == 0 &&
       (iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,&mac_sc_len,&mac_sc),
       iVar1 == 0)) &&
      ((iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,(size_t *)&s,
                                (uchar **)&kex_len), iVar1 == 0 &&
       ((iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,&comp_sc_len,&comp_sc),
        iVar1 == 0 &&
        (iVar1 = kex_string_pair(&local_b0,puStack_20,(ulong)kex._4_4_,&mac_cs_len,&mac_cs),
        iVar1 == 0)))))))) {
    data_local[0x80] = data_local[0x80] & 0xfe | *local_b0 & 1;
    if (((uint)((int)(local_b0 + 1) - (int)puStack_20) <= kex._4_4_) &&
       (((local_b0 = local_b0 + 1,
         iVar1 = kex_agree_kex_hostkey
                           ((LIBSSH2_SESSION *)data_local,hostkey,hostkey_len,crypt_cs,crypt_cs_len)
         , iVar1 == 0 &&
         (iVar1 = kex_agree_crypt((LIBSSH2_SESSION *)data_local,
                                  (libssh2_endpoint_data *)(data_local + 0x158),crypt_sc,
                                  crypt_sc_len), iVar1 == 0)) &&
        (iVar1 = kex_agree_crypt((LIBSSH2_SESSION *)data_local,
                                 (libssh2_endpoint_data *)(data_local + 0xe8),comp_cs,comp_cs_len),
        iVar1 == 0)))) {
      iVar1 = kex_agree_mac((LIBSSH2_SESSION *)data_local,
                            (libssh2_endpoint_data *)(data_local + 0x158),mac_sc,mac_sc_len);
      if ((iVar1 != 0) ||
         (iVar1 = kex_agree_mac((LIBSSH2_SESSION *)data_local,
                                (libssh2_endpoint_data *)(data_local + 0xe8),(uchar *)kex_len,
                                (unsigned_long)s), iVar1 != 0)) {
        return -1;
      }
      iVar1 = kex_agree_comp((LIBSSH2_SESSION *)data_local,
                             (libssh2_endpoint_data *)(data_local + 0x158),comp_sc,comp_sc_len);
      if ((iVar1 == 0) &&
         (iVar1 = kex_agree_comp((LIBSSH2_SESSION *)data_local,
                                 (libssh2_endpoint_data *)(data_local + 0xe8),mac_cs,mac_cs_len),
         iVar1 == 0)) {
        return 0;
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

static int kex_agree_methods(LIBSSH2_SESSION * session, unsigned char *data,
                             unsigned data_len)
{
    unsigned char *kex, *hostkey, *crypt_cs, *crypt_sc, *comp_cs, *comp_sc,
        *mac_cs, *mac_sc;
    size_t kex_len, hostkey_len, crypt_cs_len, crypt_sc_len, comp_cs_len;
    size_t comp_sc_len, mac_cs_len, mac_sc_len;
    unsigned char *s = data;

    /* Skip packet_type, we know it already */
    s++;

    /* Skip cookie, don't worry, it's preserved in the kexinit field */
    s += 16;

    /* Locate each string */
    if(kex_string_pair(&s, data, data_len, &kex_len, &kex))
        return -1;
    if(kex_string_pair(&s, data, data_len, &hostkey_len, &hostkey))
        return -1;
    if(kex_string_pair(&s, data, data_len, &crypt_cs_len, &crypt_cs))
        return -1;
    if(kex_string_pair(&s, data, data_len, &crypt_sc_len, &crypt_sc))
        return -1;
    if(kex_string_pair(&s, data, data_len, &mac_cs_len, &mac_cs))
        return -1;
    if(kex_string_pair(&s, data, data_len, &mac_sc_len, &mac_sc))
        return -1;
    if(kex_string_pair(&s, data, data_len, &comp_cs_len, &comp_cs))
        return -1;
    if(kex_string_pair(&s, data, data_len, &comp_sc_len, &comp_sc))
        return -1;

    /* If the server sent an optimistic packet, assume that it guessed wrong.
     * If the guess is determined to be right (by kex_agree_kex_hostkey)
     * This flag will be reset to zero so that it's not ignored */
    session->burn_optimistic_kexinit = *(s++);
    /* Next uint32 in packet is all zeros (reserved) */

    if (data_len < (unsigned) (s - data))
        return -1;              /* short packet */

    if (kex_agree_kex_hostkey(session, kex, kex_len, hostkey, hostkey_len)) {
        return -1;
    }

    if (kex_agree_crypt(session, &session->local, crypt_cs, crypt_cs_len)
        || kex_agree_crypt(session, &session->remote, crypt_sc, crypt_sc_len)) {
        return -1;
    }

    if (kex_agree_mac(session, &session->local, mac_cs, mac_cs_len) ||
        kex_agree_mac(session, &session->remote, mac_sc, mac_sc_len)) {
        return -1;
    }

    if (kex_agree_comp(session, &session->local, comp_cs, comp_cs_len) ||
        kex_agree_comp(session, &session->remote, comp_sc, comp_sc_len)) {
        return -1;
    }

#if 0
    if (libssh2_kex_agree_lang(session, &session->local, lang_cs, lang_cs_len)
        || libssh2_kex_agree_lang(session, &session->remote, lang_sc,
                                  lang_sc_len)) {
        return -1;
    }
#endif

    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on KEX method: %s",
                   session->kex->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on HOSTKEY method: %s",
                   session->hostkey->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on CRYPT_CS method: %s",
                   session->local.crypt->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on CRYPT_SC method: %s",
                   session->remote.crypt->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on MAC_CS method: %s",
                   session->local.mac->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on MAC_SC method: %s",
                   session->remote.mac->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on COMP_CS method: %s",
                   session->local.comp->name);
    _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Agreed on COMP_SC method: %s",
                   session->remote.comp->name);

    return 0;
}